

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads_kernel_2.h
# Opt level: O2

void __thiscall dlib::mutex::mutex(mutex *this)

{
  thread_error *this_00;
  int iVar1;
  allocator<char> local_39;
  string local_38;
  
  iVar1 = pthread_mutex_init((pthread_mutex_t *)this,(pthread_mutexattr_t *)0x0);
  if (iVar1 == 0) {
    return;
  }
  this_00 = (thread_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"in function mutex::mutex() an error occurred making the mutex",
             &local_39);
  thread_error::thread_error(this_00,ECREATE_MUTEX,&local_38);
  __cxa_throw(this_00,&thread_error::typeinfo,error::~error);
}

Assistant:

mutex (
        )
        { 
            if (pthread_mutex_init(&myMutex,0)) 
            {
                throw dlib::thread_error(ECREATE_MUTEX,
        "in function mutex::mutex() an error occurred making the mutex"
                );      
            }
        }